

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

void idr_set_num(uchar *p,int num)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = num + (int)((ulong)(long)num / 0xb640) * -0xb640;
  uVar1 = (uint)(iVar2 * 0x6523) >> 0x19;
  *p = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar1];
  uVar1 = iVar2 + uVar1 * -0x510;
  uVar3 = (uVar1 & 0xffff) * 0x71d >> 0x10;
  p[1] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar3];
  p[2] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar1 + uVar3 * -0x24 & 0xffff];
  return;
}

Assistant:

static void
idr_set_num(unsigned char *p, int num)
{
	static const char xdig[] = {
		'0', '1', '2', '3', '4', '5', '6', '7', '8', '9',
		'A', 'B', 'C', 'D', 'E', 'F', 'G', 'H', 'I', 'J',
		'K', 'L', 'M', 'N', 'O', 'P', 'Q', 'R', 'S', 'T',
		'U', 'V', 'W', 'X', 'Y', 'Z'
	};

	num %= sizeof(xdig) * sizeof(xdig) * sizeof(xdig);
	p[0] = xdig[(num / (sizeof(xdig) * sizeof(xdig)))];
	num %= sizeof(xdig) * sizeof(xdig);
	p[1] = xdig[ (num / sizeof(xdig))];
	num %= sizeof(xdig);
	p[2] = xdig[num];
}